

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

int m256v_LU_decomp_inplace(m256v *A,int *rp,int *cp)

{
  int iVar1;
  uint8_t alpha;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int r1;
  ulong uVar5;
  int j;
  ulong uVar6;
  long local_40;
  
  for (lVar2 = 0; lVar2 < A->n_row; lVar2 = lVar2 + 1) {
    rp[lVar2] = (int)lVar2;
  }
  for (lVar2 = 0; uVar3 = (ulong)A->n_col, lVar2 < (long)uVar3; lVar2 = lVar2 + 1) {
    cp[lVar2] = (int)lVar2;
  }
  local_40 = 1;
  uVar5 = 0;
  do {
    r1 = (int)uVar5;
    if (((long)(int)uVar3 <= (long)uVar5) || ((long)A->n_row <= (long)uVar5)) {
      return r1;
    }
    uVar6 = uVar5;
LAB_00101cbf:
    uVar4 = uVar5;
    if (uVar6 == (uVar3 & 0xffffffff)) {
      return r1;
    }
    while( true ) {
      if ((uint)A->n_row == uVar4) goto LAB_00101ce9;
      if (A->e[uVar6 + A->rstride * uVar4] != '\0') break;
      uVar4 = uVar4 + 1;
    }
    uVar3 = uVar4 & 0xffffffff;
    if (uVar3 != uVar5) {
      iVar1 = rp[uVar3];
      rp[uVar3] = rp[uVar5];
      rp[uVar5] = iVar1;
      m256v_swap_rows(A,r1,(int)uVar4);
    }
    uVar3 = uVar6 & 0xffffffff;
    if (uVar3 != uVar5) {
      iVar1 = cp[uVar3];
      cp[uVar3] = cp[uVar5];
      cp[uVar5] = iVar1;
      m256v_swap_cols(A,(int)uVar6,r1);
    }
    alpha = gf256_inv(A->e[uVar5 + A->rstride * uVar5]);
    m256v_mult_col_from(A,r1,r1 + 1,alpha);
    for (lVar2 = local_40; (int)lVar2 < A->n_row; lVar2 = lVar2 + 1) {
      m256v_multadd_row_from(A,r1,r1 + 1,A->e[uVar5 + A->rstride * lVar2],A,(int)lVar2);
    }
    local_40 = local_40 + 1;
    uVar3 = (ulong)(uint)A->n_col;
    uVar5 = uVar5 + 1;
  } while( true );
LAB_00101ce9:
  uVar6 = uVar6 + 1;
  goto LAB_00101cbf;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}